

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O1

void __thiscall argparse::args_t::parse_output(args_t *this,char *str)

{
  int iVar1;
  FILE *pFVar2;
  
  pFVar2 = _stdout;
  if ((str != (char *)0x0) && (iVar1 = strcmp(str,"-"), pFVar2 = _stdout, iVar1 != 0)) {
    pFVar2 = fopen(str,"wb");
  }
  this->output = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    ERROR("failed to open the OUTPUT file %s",str);
    return;
  }
  return;
}

Assistant:

void args_t::parse_output( const char * str ) {
        if ( str && strcmp( str, "-" ) )
            output = fopen( str, "wb" );
        else
            output = stdout;
        
        if ( output == NULL )
            ERROR( "failed to open the OUTPUT file %s", str );
    }